

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

RecyclableObject * __thiscall
Js::JavascriptLibrary::CreateExternalFunction_TTD(JavascriptLibrary *this,Var fname)

{
  bool bVar1;
  int32 propertyId;
  ScriptContext *pSVar2;
  DynamicType **ppDVar3;
  JavascriptExternalFunction *this_00;
  JavascriptExternalFunction *function;
  PropertyId pid;
  Var fname_local;
  JavascriptLibrary *this_local;
  
  bVar1 = TaggedInt::Is(fname);
  if (bVar1) {
    propertyId = TaggedInt::ToInt32(fname);
    pSVar2 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                       (&(this->super_JavascriptLibraryBase).scriptContext);
    bVar1 = ScriptContext::IsTrackedPropertyId(pSVar2,propertyId);
    if (!bVar1) {
      pSVar2 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                         (&(this->super_JavascriptLibraryBase).scriptContext);
      ScriptContext::TrackPid(pSVar2,propertyId);
    }
  }
  ppDVar3 = Memory::WriteBarrierPtr::operator_cast_to_DynamicType__
                      ((WriteBarrierPtr *)&this->stdCallFunctionWithDeferredPrototypeType);
  this_00 = CreateIdMappedExternalFunction<void*(*)(void*,void**,unsigned_short,Js::StdCallJavascriptMethodInfo*,void*)>
                      (this,JavascriptExternalFunction::TTDReplayDummyExternalMethod,*ppDVar3);
  RuntimeFunction::SetFunctionNameId(&this_00->super_RuntimeFunction,fname);
  JavascriptExternalFunction::SetCallbackState(this_00,(void *)0x0);
  return (RecyclableObject *)this_00;
}

Assistant:

Js::RecyclableObject* JavascriptLibrary::CreateExternalFunction_TTD(Js::Var fname)
    {
        if(TaggedInt::Is(fname))
        {
            PropertyId pid = TaggedInt::ToInt32(fname);
            if(!scriptContext->IsTrackedPropertyId(pid))
            {
                scriptContext->TrackPid(pid);
            }
        }

        JavascriptExternalFunction* function = this->CreateIdMappedExternalFunction(&JavascriptExternalFunction::TTDReplayDummyExternalMethod, stdCallFunctionWithDeferredPrototypeType);
        function->SetFunctionNameId(fname);
        function->SetCallbackState(nullptr);
        return function;
    }